

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressPNG.h
# Opt level: O1

void __thiscall adios2::core::compress::CompressPNG::~CompressPNG(CompressPNG *this)

{
  pointer pcVar1;
  
  (this->super_Operator)._vptr_Operator = (_func_int **)&PTR__CompressPNG_008893c8;
  pcVar1 = (this->m_VersionInfo)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_VersionInfo).field_2) {
    operator_delete(pcVar1);
  }
  Operator::~Operator(&this->super_Operator);
  return;
}

Assistant:

~CompressPNG() = default;